

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenBrOn(BinaryenModuleRef module,BinaryenOp op,char *name,BinaryenExpressionRef ref,
            BinaryenType castType)

{
  IString *this;
  BrOn *this_00;
  undefined1 reuse;
  string_view sVar1;
  
  reuse = SUB81(ref,0);
  this = (IString *)strlen(name);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)name;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)reuse);
  this_00 = (BrOn *)MixedArena::allocSpace(&module->allocator,0x38,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression._id = BrOnId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.type.id = 0;
  this_00->op = op;
  (this_00->name).super_IString.str = sVar1;
  this_00->ref = ref;
  (this_00->castType).id = castType;
  wasm::BrOn::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenBrOn(BinaryenModuleRef module,
                                   BinaryenOp op,
                                   const char* name,
                                   BinaryenExpressionRef ref,
                                   BinaryenType castType) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBrOn(BrOnOp(op), name, (Expression*)ref, Type(castType)));
}